

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrivateUtils.cpp
# Opt level: O3

Matrix3d * iDynTree::squareCrossProductMatrix(Vector3d *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Matrix3d *ret;
  Matrix3d *in_RDI;
  
  dVar1 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       -(dVar3 * dVar3 + dVar1 * dVar1);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar2 * dVar3;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       dVar2 * dVar3;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       -(dVar1 * dVar1 + dVar2 * dVar2);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       dVar1 * dVar3;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar1 * dVar2;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar1 * dVar3;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar1 * dVar2;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       -(dVar3 * dVar3 + dVar2 * dVar2);
  return in_RDI;
}

Assistant:

Eigen::Matrix3d squareCrossProductMatrix(const Eigen::Vector3d & v)
{
    Eigen::Matrix3d ret;

    double vSqr[3];
    vSqr[0] = v[0]*v[0];
    vSqr[1] = v[1]*v[1];
    vSqr[2] = v[2]*v[2];

    ret <<  -(vSqr[1]+vSqr[2]),         v[0]*v[1],          v[0]*v[2],
                    v[0]*v[1], -(vSqr[0]+vSqr[2]),          v[1]*v[2],
                    v[0]*v[2],          v[1]*v[2], -(vSqr[0]+vSqr[1]);

    return ret;
}